

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::equalityRowAddition<HighsTripletTreeSlicePreOrder>
          (HighsPostsolveStack *this,HighsInt row,HighsInt addedEqRow,double eqRowScale,
          HighsMatrixSlice<HighsTripletTreeSlicePreOrder> *eqRowVec)

{
  pointer pNVar1;
  pointer piVar2;
  double local_c0;
  iterator __end0;
  iterator __begin0;
  
  pNVar1 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin(&__begin0,eqRowVec);
  __end0.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __end0.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __end0.nodeLeft = (HighsInt *)0x0;
  __end0.nodeRight = (HighsInt *)0x0;
  __end0.pos_.index_ = (HighsInt *)0x0;
  __end0.pos_.value_ = (double *)0x0;
  __end0.stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __end0.currentNode = -1;
  while (__begin0.currentNode != __end0.currentNode) {
    local_c0 = *__begin0.pos_.value_;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->rowValues,
               (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start +
               *(int *)CONCAT44(__begin0.pos_.index_._4_4_,(int)__begin0.pos_.index_),&local_c0);
    HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++(&__begin0);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&__end0.stack.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&__begin0.stack.super__Vector_base<int,_std::allocator<int>_>);
  piVar2 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __begin0.pos_.index_._0_4_ = piVar2[row];
  __begin0.pos_.index_._4_4_ = piVar2[addedEqRow];
  __begin0.pos_.value_ = (double *)eqRowScale;
  HighsDataStack::push<presolve::HighsPostsolveStack::EqualityRowAddition,_0>
            (&this->reductionValues,(EqualityRowAddition *)&__begin0);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,&this->rowValues);
  reductionAdded(this,kEqualityRowAddition);
  return;
}

Assistant:

void equalityRowAddition(HighsInt row, HighsInt addedEqRow, double eqRowScale,
                           const HighsMatrixSlice<RowStorageFormat>& eqRowVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : eqRowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(EqualityRowAddition{
        origRowIndex[row], origRowIndex[addedEqRow], eqRowScale});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kEqualityRowAddition);
  }